

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O3

void KINErrHandler(int error_code,char *module,char *function,char *msg,void *data)

{
  char err_type [10];
  undefined8 local_20 [2];
  
  if (error_code == 99) {
    local_20[0] = 0x474e494e524157;
  }
  else {
    local_20[0] = CONCAT26(local_20[0]._6_2_,0x5200000000);
    local_20[0] = CONCAT44(local_20[0]._4_4_,0x4f525245);
  }
  if (*(FILE **)((long)data + 0x260) != (FILE *)0x0) {
    fprintf(*(FILE **)((long)data + 0x260),"\n[%s %s]  %s\n",module,local_20,function);
    fprintf(*(FILE **)((long)data + 0x260),"  %s\n\n",msg);
  }
  return;
}

Assistant:

void KINErrHandler(int error_code, const char *module,
                   const char *function, char *msg, void *data)
{
  KINMem kin_mem;
  char err_type[10];

  /* data points to kin_mem here */

  kin_mem = (KINMem) data;

  if (error_code == KIN_WARNING)
    sprintf(err_type,"WARNING");
  else
    sprintf(err_type,"ERROR");

#ifndef NO_FPRINTF_OUTPUT
  if (kin_mem->kin_errfp != NULL) {
    fprintf(kin_mem->kin_errfp,"\n[%s %s]  %s\n",module,err_type,function);
    fprintf(kin_mem->kin_errfp,"  %s\n\n",msg);
  }
#endif

  return;
}